

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt.h
# Opt level: O3

void haarXY(integral_image *iimage,int row,int col,int scale,float *haarX,float *haarY)

{
  int iVar1;
  int iVar2;
  int iVar3;
  float *pfVar4;
  undefined1 auVar5 [16];
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int _b;
  int iVar11;
  int iVar12;
  int iVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  
  iVar1 = iimage->height;
  iVar2 = iimage->width;
  iVar10 = row + scale * 2;
  fVar14 = 0.0;
  fVar15 = 0.0;
  iVar9 = col + scale * 2;
  iVar12 = row;
  if (iVar1 < row) {
    iVar12 = iVar1;
  }
  iVar3 = iimage->data_width;
  iVar6 = col;
  if (iVar2 < col) {
    iVar6 = iVar2;
  }
  iVar13 = iVar12 + -1;
  iVar7 = scale + row;
  if (iVar1 <= scale + row) {
    iVar7 = iVar1;
  }
  iVar11 = iVar6 + -1;
  iVar8 = scale + col;
  if (iVar2 <= scale + col) {
    iVar8 = iVar2;
  }
  if (iVar10 < iVar1) {
    iVar1 = iVar10;
  }
  if (iVar9 < iVar2) {
    iVar2 = iVar9;
  }
  pfVar4 = iimage->data;
  if (0 < iVar6 && 0 < iVar12) {
    fVar15 = pfVar4[iVar13 * iVar3 + iVar11];
  }
  if (0 < iVar8 && 0 < iVar12) {
    fVar14 = pfVar4[iVar13 * iVar3 + iVar8 + -1];
  }
  iVar9 = iVar2 + -1;
  fVar16 = 0.0;
  fVar17 = 0.0;
  if (0 < iVar2 && 0 < iVar12) {
    fVar17 = pfVar4[iVar13 * iVar3 + iVar9];
  }
  if (0 < iVar7 && 0 < iVar6) {
    fVar16 = pfVar4[(iVar7 + -1) * iVar3 + iVar11];
  }
  fVar19 = 0.0;
  fVar18 = 0.0;
  if (0 < iVar2 && 0 < iVar7) {
    fVar18 = pfVar4[(iVar7 + -1) * iVar3 + iVar9];
  }
  iVar12 = iVar1 + -1;
  if (0 < iVar1 && 0 < iVar6) {
    fVar19 = pfVar4[iVar12 * iVar3 + iVar11];
  }
  fVar21 = 0.0;
  fVar20 = 0.0;
  if (0 < iVar8 && 0 < iVar1) {
    fVar20 = pfVar4[iVar12 * iVar3 + iVar8 + -1];
  }
  if (0 < iVar2 && 0 < iVar1) {
    fVar21 = pfVar4[iVar12 * iVar3 + iVar9];
  }
  auVar5 = vfmadd213ss_fma(ZEXT416((uint)(fVar14 - fVar20)),SUB6416(ZEXT464(0x40000000),0),
                           ZEXT416((uint)(fVar21 - fVar15)));
  *haarX = (fVar19 - fVar17) + auVar5._0_4_;
  auVar5 = vfmadd213ss_fma(ZEXT416((uint)(fVar16 - fVar18)),SUB6416(ZEXT464(0x40000000),0),
                           ZEXT416((uint)(fVar21 - fVar15)));
  *haarY = auVar5._0_4_ - (fVar19 - fVar17);
  return;
}

Assistant:

inline void haarXY(struct integral_image *iimage, int row, int col, int scale, float* haarX, float* haarY) {
    
    // TODO: (Sebastian) fix for iimage with padding
    int width = iimage->width;
    int height = iimage->height;

    // subtracting by one for row/col because row/col is inclusive.
    int r0 = MIN(row, height) - 1;         
    int c0 = MIN(col, width) - 1;         
    int r1 = MIN(row + scale, height) - 1;  
    int c1 = MIN(col + scale, width) - 1;   
    int r2 = MIN(row + 2*scale, height) - 1;
    int c2 = MIN(col + 2*scale, width) - 1;

    float r0c0 = 0.0f; // A
    float r0c1 = 0.0f; // B
    float r0c2 = 0.0f; // C
    float r1c0 = 0.0f; // D
    float r1c2 = 0.0f; // E
    float r2c0 = 0.0f; // F
    float r2c1 = 0.0f; // G
    float r2c2 = 0.0f; // H

    float *data = iimage->data;
    int data_width = iimage->data_width;

    if (r0 >= 0 && c0 >= 0)  {
        r0c0 = data[r0 * data_width + c0];
    }
    if (r0 >= 0 && c1 >= 0) {
        r0c1 = data[r0 * data_width + c1];
    }
    if (r0 >= 0 && c2 >= 0) {
        r0c2 = data[r0 * data_width + c2];
    }
    if (r1 >= 0 && c0 >= 0) {
        r1c0 = data[r1 * data_width + c0];
    }
    if (r1 >= 0 && c2 >= 0) {
        r1c2 = data[r1 * data_width + c2];
    }
    if (r2 >= 0 && c0 >= 0) {
        r2c0 = data[r2 * data_width + c0];
    }
    if (r2 >= 0 && c1 >= 0) {
        r2c1 = data[r2 * data_width + c1];
    }
    if (r2 >= 0 && c2 >= 0) {
        r2c2 = data[r2 * data_width + c2];
    }


    // *haarX = (r0c1 - r0c2 - r2c1 + r2c2) - (r0c0 - r0c1 - r2c0 + r2c1);
    // *haarY = (r1c0 - r1c2 - r2c0 + r2c2) - (r0c0 - r0c2 - r1c0 + r1c2);

    float r2c2_sub_r0c0 = r2c2 - r0c0;
    float r2c0_sub_r0c2 = r2c0 - r0c2;

    *haarX = 2*(r0c1 - r2c1) + r2c2_sub_r0c0 + r2c0_sub_r0c2;
    *haarY = 2*(r1c0 - r1c2) + r2c2_sub_r0c0 - r2c0_sub_r0c2;

    // for FMA
    // *haarX = (2*r0c1 + r2c0_sub_r0c2) - (2*r2c1 - r2c2_sub_r0c0);
    // *haarY = (2*r1c0 - r2c0_sub_r0c2) - (2*r1c2 - r2c2_sub_r0c0);
}